

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O2

void uv__fs_work(uv__work *w)

{
  uv_loop_s **buf;
  int iVar1;
  uv__work *ptr;
  iovec *piVar2;
  _func_void_uv__work_ptr_int *p_Var3;
  bool bVar4;
  uint uVar5;
  uv_dirent_type_t uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint *puVar11;
  ssize_t sVar12;
  size_t sVar13;
  _func_void_uv__work_ptr *__buf;
  dirent64 *dent;
  char *pcVar14;
  _func_void_uv__work_ptr *p_Var15;
  DIR *pDVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  iovec *iov;
  code *pcVar20;
  _func_void_uv__work_ptr_int *p_Var21;
  _func_void_uv__work_ptr_int *p_Var22;
  size_t sVar23;
  size_t __nbytes;
  long lVar24;
  double dVar25;
  _func_void_uv__work_ptr_int *p_StackY_2130;
  uint local_2114;
  _func_void_uv__work_ptr_int *local_20f0;
  _func_void_uv__work_ptr_int *local_20d0;
  pollfd pfd;
  __mode_t local_20b0;
  size_t local_2098;
  uv_fs_t fs_req;
  
  iVar1 = *(int *)&w[-7].done;
  puVar11 = (uint *)__errno_location();
  buf = &w[-6].loop;
  do {
    *puVar11 = 0;
    switch(*(undefined4 *)&w[-7].done) {
    case 1:
      if (uv__fs_open_no_cloexec_support != '\0') {
LAB_001171ec:
        if (w[-7].wq[0] != (void *)0x0) {
          uv_rwlock_rdlock(&(w[-7].loop)->cloexec_lock);
        }
        iVar7 = open64((char *)w[-6].done,*(int *)((long)w[-2].wq + 4),
                       (ulong)*(uint *)(w[-2].wq + 1));
        if ((-1 < iVar7) && (iVar10 = uv__cloexec_ioctl(iVar7,1), iVar10 != 0)) {
          iVar7 = uv__close(iVar7);
          if (iVar7 != 0) {
switchD_001171ab_default:
            abort();
          }
          iVar7 = -1;
        }
        if (w[-7].wq[0] != (void *)0x0) {
          uv_rwlock_rdunlock(&(w[-7].loop)->cloexec_lock);
        }
LAB_00117c6b:
        p_StackY_2130 = (_func_void_uv__work_ptr_int *)(long)iVar7;
        goto LAB_00117bb0;
      }
      uVar9 = open64((char *)w[-6].done,*(uint *)((long)w[-2].wq + 4) | 0x80000,
                     (ulong)*(uint *)(w[-2].wq + 1));
      if ((int)uVar9 < 0) {
        if (*puVar11 != 0x16) break;
        uv__fs_open_no_cloexec_support = '\x01';
        goto LAB_001171ec;
      }
      p_StackY_2130 = (_func_void_uv__work_ptr_int *)(ulong)uVar9;
      goto LAB_00117f0c;
    case 2:
      uVar9 = uv__close_nocancel(*(int *)w[-2].wq);
      if (uVar9 == 0xffffffff) {
        uVar9 = -(uint)(*puVar11 != 0x73 && *puVar11 != 4);
      }
      break;
    case 3:
      uVar5 = uv__getiovmax();
      uVar9 = *(uint *)((long)w[-2].wq + 0xc);
      if (uVar5 < uVar9) {
        *(uint *)((long)w[-2].wq + 0xc) = uVar5;
        uVar9 = uVar5;
      }
      p_Var22 = w[-1].done;
      if ((long)p_Var22 < 0) {
        piVar2 = (iovec *)w[-1].work;
        if (uVar9 == 1) {
          p_StackY_2130 =
               (_func_void_uv__work_ptr_int *)
               read(*(int *)w[-2].wq,piVar2->iov_base,piVar2->iov_len);
        }
        else {
          p_StackY_2130 = (_func_void_uv__work_ptr_int *)readv(*(int *)w[-2].wq,piVar2,uVar9);
        }
      }
      else if ((uVar9 == 1) || (uv__fs_read_no_preadv == '\x01')) {
LAB_0011760b:
        p_StackY_2130 =
             (_func_void_uv__work_ptr_int *)
             pread64(*(int *)w[-2].wq,*(void **)w[-1].work,*(size_t *)(w[-1].work + 8),
                     (__off64_t)p_Var22);
      }
      else {
        p_StackY_2130 =
             (_func_void_uv__work_ptr_int *)
             uv__preadv(*(int *)w[-2].wq,(iovec *)w[-1].work,uVar9,(int64_t)p_Var22);
        if (p_StackY_2130 == (_func_void_uv__work_ptr_int *)0xffffffffffffffff) {
          if (*puVar11 == 0x26) {
            uv__fs_read_no_preadv = '\x01';
            p_Var22 = w[-1].done;
            goto LAB_0011760b;
          }
          p_StackY_2130 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
        }
      }
      if ((uv__work *)w[-1].work != w + 1) {
        uv__free((uv__work *)w[-1].work);
      }
      w[-1].work = (_func_void_uv__work_ptr *)0x0;
      *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
      goto LAB_00117bb0;
    case 4:
      uVar5 = uv__getiovmax();
      uVar9 = *(uint *)((long)w[-2].wq + 0xc);
      ptr = (uv__work *)w[-1].work;
      p_Var22 = (_func_void_uv__work_ptr_int *)0x0;
LAB_00117645:
      if (uVar9 != 0) {
        uVar19 = uVar5;
        if (uVar9 < uVar5) {
          uVar19 = uVar9;
        }
        *(uint *)((long)w[-2].wq + 0xc) = uVar19;
        do {
          p_Var21 = w[-1].done;
          if ((long)p_Var21 < 0) {
            piVar2 = (iovec *)w[-1].work;
            if (uVar19 == 1) {
              p_StackY_2130 =
                   (_func_void_uv__work_ptr_int *)
                   write(*(int *)w[-2].wq,piVar2->iov_base,piVar2->iov_len);
            }
            else {
              p_StackY_2130 = (_func_void_uv__work_ptr_int *)writev(*(int *)w[-2].wq,piVar2,uVar19);
            }
LAB_001176bb:
            if (-1 < (long)p_StackY_2130) goto LAB_001176f7;
            uVar19 = *puVar11;
          }
          else {
            iov = (iovec *)w[-1].work;
            if ((uVar19 == 1) || (uv__fs_write_no_pwritev == '\x01')) {
LAB_00117675:
              p_StackY_2130 =
                   (_func_void_uv__work_ptr_int *)
                   pwrite64(*(int *)w[-2].wq,iov->iov_base,iov->iov_len,(__off64_t)p_Var21);
              goto LAB_001176bb;
            }
            p_StackY_2130 =
                 (_func_void_uv__work_ptr_int *)
                 uv__pwritev(*(int *)w[-2].wq,iov,uVar19,(int64_t)p_Var21);
            if (p_StackY_2130 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff)
            goto LAB_001176bb;
            uVar19 = *puVar11;
            if (uVar19 == 0x26) {
              uv__fs_write_no_pwritev = '\x01';
              iov = (iovec *)w[-1].work;
              p_Var21 = w[-1].done;
              goto LAB_00117675;
            }
            p_StackY_2130 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
          }
          if (uVar19 != 4) goto LAB_00117e60;
          uVar19 = *(uint *)((long)w[-2].wq + 0xc);
        } while( true );
      }
LAB_00117e67:
      if (ptr != w + 1) {
        uv__free(ptr);
      }
      w[-1].work = (_func_void_uv__work_ptr *)0x0;
      *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
      p_StackY_2130 = p_Var22;
      goto LAB_00117bb0;
    case 5:
      local_20d0 = w[-1].done;
      sVar12 = sendfile64(*(int *)w[-2].wq,*(int *)((long)w[-2].wq + 4),(__off64_t *)&local_20d0,
                          (size_t)w[1].done);
      local_20f0 = w[-1].done;
      p_StackY_2130 = local_20d0 + -(long)local_20f0;
      p_Var22 = local_20d0;
      if ((p_StackY_2130 == (_func_void_uv__work_ptr_int *)0x0 ||
          (long)local_20d0 < (long)local_20f0) && sVar12 == -1) {
        uVar9 = *puVar11;
        if (((uVar9 < 0x17) && ((0x440020U >> (uVar9 & 0x1f) & 1) != 0)) || (uVar9 == 0x58)) {
          bVar4 = true;
          *puVar11 = 0;
          p_Var21 = w[1].done;
          iVar7 = *(int *)w[-2].wq;
          iVar10 = *(int *)((long)w[-2].wq + 4);
          p_StackY_2130 = (_func_void_uv__work_ptr_int *)0x0;
LAB_0011733d:
          do {
            uVar18 = (long)p_Var21 - (long)p_StackY_2130;
            p_Var22 = local_20f0;
            if (p_Var21 < p_StackY_2130 || uVar18 == 0) {
LAB_00117db4:
              if (p_StackY_2130 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff)
              goto LAB_00117dcf;
              break;
            }
            __nbytes = 0x2000;
            if (uVar18 < 0x2000) {
              __nbytes = uVar18;
            }
            do {
              if (bVar4) {
                lVar24 = pread64(iVar10,&fs_req,__nbytes,(__off64_t)local_20f0);
              }
              else {
                lVar24 = read(iVar10,&fs_req,__nbytes);
              }
              if (lVar24 != -1) {
                if (lVar24 == 0) goto LAB_00117db4;
                lVar17 = 0;
                goto LAB_001173e0;
              }
              uVar9 = *puVar11;
            } while (uVar9 == 4);
            if ((p_StackY_2130 != (_func_void_uv__work_ptr_int *)0x0) || (!bVar4)) {
              if ((code *)0x1 < p_StackY_2130 + 1) goto LAB_00117dcf;
              break;
            }
            p_StackY_2130 = (_func_void_uv__work_ptr_int *)0x0;
            bVar4 = false;
          } while ((uVar9 == 5) || (uVar9 == 0x1d));
        }
        p_StackY_2130 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      }
      else {
LAB_00117dcf:
        w[-1].done = p_Var22;
      }
      goto LAB_00117bb0;
    case 6:
      p_Var22 = w[-6].done;
      uVar9 = uv__fs_statx(-1,(char *)p_Var22,0,0,(uv_stat_t *)buf);
      if (uVar9 == 0xffffffda) {
        uVar9 = stat64((char *)p_Var22,(stat64 *)&fs_req);
LAB_00117967:
        if (uVar9 == 0) {
          uv__to_stat((stat *)&fs_req,(uv_stat_t *)buf);
          uVar9 = 0;
        }
      }
      break;
    case 7:
      p_Var22 = w[-6].done;
      uVar9 = uv__fs_statx(-1,(char *)p_Var22,0,1,(uv_stat_t *)buf);
      if (uVar9 == 0xffffffda) {
        uVar9 = lstat64((char *)p_Var22,(stat64 *)&fs_req);
        goto LAB_00117967;
      }
      break;
    case 8:
      iVar7 = *(int *)w[-2].wq;
      uVar9 = uv__fs_statx(iVar7,"",1,0,(uv_stat_t *)buf);
      if ((uVar9 == 0xffffffda) && (uVar9 = fstat64(iVar7,(stat64 *)&fs_req), uVar9 == 0)) {
        uv__to_stat((stat *)&fs_req,(uv_stat_t *)buf);
        uVar9 = 0;
      }
      break;
    case 9:
      uVar9 = ftruncate64(*(int *)w[-2].wq,(__off64_t)w[-1].done);
      break;
    case 10:
      fs_req.data = (void *)(long)(double)w[-1].wq[0];
      dVar25 = (double)w[-1].wq[0] * 1000000.0;
      uVar18 = (ulong)dVar25;
      fs_req._8_8_ = (((long)(dVar25 - 9.223372036854776e+18) & (long)uVar18 >> 0x3f | uVar18) %
                     1000000) * 1000;
      fs_req.reserved[0] = (void *)(long)(double)w[-1].wq[1];
      dVar25 = (double)w[-1].wq[1] * 1000000.0;
      uVar18 = (ulong)dVar25;
      fs_req.reserved[1] =
           (void *)((((long)(dVar25 - 9.223372036854776e+18) & (long)uVar18 >> 0x3f | uVar18) %
                    1000000) * 1000);
      uVar9 = utimensat(-100,(char *)w[-6].done,(timespec *)&fs_req,0);
      break;
    case 0xb:
      fs_req.data = (void *)(long)(double)w[-1].wq[0];
      dVar25 = (double)w[-1].wq[0] * 1000000.0;
      uVar18 = (ulong)dVar25;
      fs_req._8_8_ = (((long)(dVar25 - 9.223372036854776e+18) & (long)uVar18 >> 0x3f | uVar18) %
                     1000000) * 1000;
      fs_req.reserved[0] = (void *)(long)(double)w[-1].wq[1];
      dVar25 = (double)w[-1].wq[1] * 1000000.0;
      uVar18 = (ulong)dVar25;
      fs_req.reserved[1] =
           (void *)((((long)(dVar25 - 9.223372036854776e+18) & (long)uVar18 >> 0x3f | uVar18) %
                    1000000) * 1000);
      uVar9 = futimens(*(int *)w[-2].wq,(timespec *)&fs_req);
      break;
    case 0xc:
      uVar9 = access((char *)w[-6].done,*(int *)((long)w[-2].wq + 4));
      break;
    case 0xd:
      uVar9 = chmod((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
      break;
    case 0xe:
      uVar9 = fchmod(*(int *)w[-2].wq,*(__mode_t *)(w[-2].wq + 1));
      break;
    case 0xf:
      uVar9 = fsync(*(int *)w[-2].wq);
      break;
    case 0x10:
      uVar9 = fdatasync(*(int *)w[-2].wq);
      break;
    case 0x11:
      uVar9 = unlink((char *)w[-6].done);
      break;
    case 0x12:
      uVar9 = rmdir((char *)w[-6].done);
      break;
    case 0x13:
      uVar9 = mkdir((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
      break;
    case 0x14:
      pcVar14 = mkdtemp((char *)w[-6].done);
      p_StackY_2130 = (_func_void_uv__work_ptr_int *)-(ulong)(pcVar14 == (char *)0x0);
      goto LAB_00117bb0;
    case 0x15:
      uVar9 = rename((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x16:
      fs_req.data = (void *)0x0;
      iVar7 = scandir64((char *)w[-6].done,(dirent64 ***)&fs_req,uv__fs_scandir_filter,
                        uv__fs_scandir_sort);
      *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
      if (iVar7 != -1) {
        p_Var15 = (_func_void_uv__work_ptr *)fs_req.data;
        if (iVar7 == 0) {
          free(fs_req.data);
          p_Var15 = (_func_void_uv__work_ptr *)0x0;
        }
        w[-6].work = p_Var15;
        goto LAB_00117c6b;
      }
LAB_00117d9f:
      p_StackY_2130 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      goto LAB_00117bb0;
    case 0x17:
      uVar9 = link((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x18:
      uVar9 = symlink((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x19:
      sVar13 = pathconf((char *)w[-6].done,4);
      sVar23 = 0x100;
      if (sVar13 != 0xffffffffffffffff) {
        sVar23 = sVar13;
      }
      __buf = (_func_void_uv__work_ptr *)uv__malloc(sVar23);
      if (__buf == (_func_void_uv__work_ptr *)0x0) {
        *puVar11 = 0xc;
      }
      else {
        sVar13 = readlink((char *)w[-6].done,(char *)__buf,sVar23);
        if ((sVar13 != 0xffffffffffffffff) &&
           ((p_Var15 = __buf, sVar13 != sVar23 ||
            (p_Var15 = (_func_void_uv__work_ptr *)uv__realloc(__buf,sVar23 + 1), sVar13 = sVar23,
            p_Var15 != (_func_void_uv__work_ptr *)0x0)))) {
          p_Var15[sVar13] = (_func_void_uv__work_ptr)0x0;
          goto LAB_00117f51;
        }
        uv__free(__buf);
      }
      goto LAB_00117bba;
    case 0x1a:
      uVar9 = chown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
      break;
    case 0x1b:
      uVar9 = fchown(*(int *)w[-2].wq,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
      break;
    case 0x1c:
      p_Var15 = (_func_void_uv__work_ptr *)realpath((char *)w[-6].done,(char *)0x0);
      if (p_Var15 != (_func_void_uv__work_ptr *)0x0) goto LAB_00117f51;
      goto LAB_00117bba;
    case 0x1d:
      uVar9 = uv_fs_open((uv_loop_t *)0x0,&fs_req,(char *)w[-6].done,0,0,(uv_fs_cb)0x0);
      uv_fs_req_cleanup(&fs_req);
      if (-1 < (int)uVar9) {
        iVar7 = fstat64(uVar9,(stat64 *)&pfd);
        if (iVar7 == 0) {
          iVar7 = uv_fs_open((uv_loop_t *)0x0,&fs_req,(char *)w[-2].loop,
                             (*(uint *)((long)w[-2].wq + 4) & 1) << 7 | 0x241,local_20b0,
                             (uv_fs_cb)0x0);
          uv_fs_req_cleanup(&fs_req);
          iVar10 = iVar7;
          if (-1 < iVar7) {
            iVar10 = fchmod(iVar7,local_20b0);
            if (iVar10 == -1) goto LAB_00117b18;
            if (((ulong)w[-2].wq[0] & 0x600000000) == 0) {
LAB_00117d31:
              lVar24 = 0;
              for (sVar23 = local_2098; sVar23 != 0; sVar23 = sVar23 - fs_req.result) {
                iVar10 = uv_fs_sendfile((uv_loop_t *)0x0,&fs_req,iVar7,uVar9,lVar24,sVar23,
                                        (uv_fs_cb)0x0);
                uv_fs_req_cleanup(&fs_req);
                if (iVar10 < 0) goto LAB_00117b2c;
                lVar24 = lVar24 + fs_req.result;
              }
            }
            else {
              iVar10 = ioctl(iVar7,0x40049409,(ulong)uVar9);
              if (iVar10 == -1) {
                uVar5 = *puVar11;
                if (((uVar5 == 0x12) || (uVar5 == 0x5f)) || (uVar5 == 0x19)) {
                  if (((ulong)w[-2].wq[0] & 0x400000000) != 0) {
                    iVar10 = -0x5f;
                    goto LAB_00117b2c;
                  }
                  goto LAB_00117d31;
                }
                goto LAB_00117b1f;
              }
            }
            iVar10 = 0;
          }
        }
        else {
          iVar7 = -1;
LAB_00117b18:
          uVar5 = *puVar11;
LAB_00117b1f:
          iVar10 = 0;
          if (0 < (int)uVar5) {
            iVar10 = -uVar5;
          }
        }
LAB_00117b2c:
        iVar8 = uv__close_nocheckstdio(uVar9);
        if (iVar8 == 0) {
          iVar8 = iVar10;
        }
        if (iVar10 != 0) {
          iVar8 = iVar10;
        }
        if (iVar7 < 0) {
          if (iVar8 == 0) goto LAB_00117da5;
        }
        else {
          iVar7 = uv__close_nocheckstdio(iVar7);
          if (iVar7 == 0) {
            iVar7 = iVar8;
          }
          if (iVar8 == 0) {
            iVar8 = iVar7;
          }
          if (iVar8 == 0) {
LAB_00117da5:
            p_StackY_2130 = (_func_void_uv__work_ptr_int *)0x0;
            goto LAB_00117bb0;
          }
          uv_fs_unlink((uv_loop_t *)0x0,&fs_req,(char *)w[-2].loop,(uv_fs_cb)0x0);
          uv_fs_req_cleanup(&fs_req);
        }
        *puVar11 = -iVar8;
        goto LAB_00117d9f;
      }
      p_StackY_2130 = (_func_void_uv__work_ptr_int *)(long)(int)uVar9;
      goto LAB_00117bb0;
    case 0x1e:
      uVar9 = lchown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4))
      ;
      break;
    case 0x1f:
      p_Var15 = (_func_void_uv__work_ptr *)uv__malloc(0x38);
      if (p_Var15 == (_func_void_uv__work_ptr *)0x0) {
LAB_00117bd9:
        p_StackY_2130 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
        uv__free(p_Var15);
        p_Var15 = (_func_void_uv__work_ptr *)0x0;
      }
      else {
        pDVar16 = opendir((char *)w[-6].done);
        *(DIR **)(p_Var15 + 0x30) = pDVar16;
        if (pDVar16 == (DIR *)0x0) goto LAB_00117bd9;
        p_StackY_2130 = (_func_void_uv__work_ptr_int *)0x0;
      }
      w[-6].work = p_Var15;
      goto LAB_00117bb0;
    case 0x20:
      p_Var15 = w[-6].work;
      local_2114 = 0;
      while( true ) {
        uVar18 = (ulong)local_2114;
        do {
          if (*(ulong *)(p_Var15 + 8) <= uVar18) goto LAB_00117c7a;
          *puVar11 = 0;
          dent = readdir64(*(DIR **)(p_Var15 + 0x30));
          if (dent == (dirent64 *)0x0) {
            if (*puVar11 != 0) goto LAB_00117bfb;
            goto LAB_00117c7a;
          }
        } while ((dent->d_name[0] == '.') &&
                ((dent->d_name[1] == '\0' || ((dent->d_name[1] == '.' && (dent->d_name[2] == '\0')))
                 )));
        lVar24 = *(long *)p_Var15;
        pcVar14 = uv__strdup(dent->d_name);
        *(char **)(lVar24 + uVar18 * 0x10) = pcVar14;
        if (pcVar14 == (char *)0x0) break;
        uVar6 = uv__fs_get_dirent_type((uv__dirent_t *)dent);
        *(uv_dirent_type_t *)(lVar24 + uVar18 * 0x10 + 8) = uVar6;
        local_2114 = local_2114 + 1;
      }
LAB_00117bfb:
      for (lVar24 = 0; uVar18 << 4 != lVar24; lVar24 = lVar24 + 0x10) {
        uv__free(*(void **)(*(long *)p_Var15 + lVar24));
        *(undefined8 *)(*(long *)p_Var15 + lVar24) = 0;
      }
      local_2114 = 0xffffffff;
LAB_00117c7a:
      p_StackY_2130 = (_func_void_uv__work_ptr_int *)(long)(int)local_2114;
      goto LAB_00117bb0;
    case 0x21:
      p_Var15 = w[-6].work;
      if (*(DIR **)(p_Var15 + 0x30) != (DIR *)0x0) {
        closedir(*(DIR **)(p_Var15 + 0x30));
        *(undefined8 *)(p_Var15 + 0x30) = 0;
        p_Var15 = w[-6].work;
      }
      uv__free(p_Var15);
      p_Var15 = (_func_void_uv__work_ptr *)0x0;
LAB_00117f51:
      w[-6].work = p_Var15;
      w[-7].wq[1] = (void *)0x0;
      goto LAB_00117f18;
    default:
      goto switchD_001171ab_default;
    }
    p_StackY_2130 = (_func_void_uv__work_ptr_int *)(long)(int)uVar9;
LAB_00117bb0:
    if (p_StackY_2130 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) {
LAB_00117f0c:
      w[-7].wq[1] = p_StackY_2130;
      if (p_StackY_2130 != (_func_void_uv__work_ptr_int *)0x0) {
        return;
      }
LAB_00117f18:
      if (2 < *(int *)&w[-7].done - 6U) {
        return;
      }
      w[-6].work = (_func_void_uv__work_ptr *)buf;
      return;
    }
LAB_00117bba:
    if ((0xfffffffd < iVar1 - 4U) || (*puVar11 != 4)) {
      w[-7].wq[1] = (void *)-(long)(int)*puVar11;
      return;
    }
  } while( true );
LAB_001173e0:
  if (lVar24 - lVar17 != 0 && lVar17 <= lVar24) {
LAB_001173ff:
    do {
      sVar12 = write(iVar7,(void *)((long)fs_req.reserved + lVar17 + -0x10),lVar24 - lVar17);
      if (sVar12 != -1) goto LAB_0011746f;
      if (*puVar11 != 4) {
        if (*puVar11 == 0xb) {
          pfd.events = 4;
          pfd.revents = 0;
          pfd.fd = iVar7;
          while (iVar8 = poll((pollfd *)&pfd,1,-1), iVar8 == -1) {
            if (*puVar11 != 4) goto LAB_00117dfe;
          }
          if ((pfd._4_4_ & 0xfffb0000) == 0) goto LAB_001173ff;
LAB_00117dfe:
          *puVar11 = 5;
        }
        p_StackY_2130 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
        goto LAB_00117bb0;
      }
    } while( true );
  }
  local_20f0 = local_20f0 + lVar24;
  p_StackY_2130 = p_StackY_2130 + lVar24;
  goto LAB_0011733d;
LAB_0011746f:
  lVar17 = lVar17 + sVar12;
  goto LAB_001173e0;
LAB_001176f7:
  if (p_StackY_2130 == (_func_void_uv__work_ptr_int *)0x0) {
    p_StackY_2130 = (_func_void_uv__work_ptr_int *)0x0;
LAB_00117e60:
    if (p_Var22 == (_func_void_uv__work_ptr_int *)0x0) {
      p_Var22 = p_StackY_2130;
    }
    goto LAB_00117e67;
  }
  if (-1 < (long)w[-1].done) {
    w[-1].done = w[-1].done + (long)p_StackY_2130;
  }
  p_Var15 = w[-1].work;
  pcVar20 = p_Var15 + 8;
  uVar19 = 0;
  for (p_Var21 = p_StackY_2130; p_Var21 != (_func_void_uv__work_ptr_int *)0x0;
      p_Var21 = p_Var21 + -(long)p_Var3) {
    p_Var3 = *(_func_void_uv__work_ptr_int **)pcVar20;
    if (p_Var21 <= p_Var3 && (long)p_Var3 - (long)p_Var21 != 0) {
      *(_func_void_uv__work_ptr_int **)(pcVar20 + -8) = p_Var21 + *(ulong *)(pcVar20 + -8);
      *(long *)pcVar20 = (long)p_Var3 - (long)p_Var21;
      break;
    }
    uVar19 = uVar19 + 1;
    pcVar20 = pcVar20 + 0x10;
  }
  *(uint *)((long)w[-2].wq + 0xc) = uVar19;
  w[-1].work = p_Var15 + (ulong)uVar19 * 0x10;
  uVar9 = uVar9 - uVar19;
  p_Var22 = p_Var22 + (long)p_StackY_2130;
  goto LAB_00117645;
}

Assistant:

static void uv__fs_work(struct uv__work* w) {
  int retry_on_eintr;
  uv_fs_t* req;
  ssize_t r;

  req = container_of(w, uv_fs_t, work_req);
  retry_on_eintr = !(req->fs_type == UV_FS_CLOSE ||
                     req->fs_type == UV_FS_READ);

  do {
    errno = 0;

#define X(type, action)                                                       \
  case UV_FS_ ## type:                                                        \
    r = action;                                                               \
    break;

    switch (req->fs_type) {
    X(ACCESS, access(req->path, req->flags));
    X(CHMOD, chmod(req->path, req->mode));
    X(CHOWN, chown(req->path, req->uid, req->gid));
    X(CLOSE, uv__fs_close(req->file));
    X(COPYFILE, uv__fs_copyfile(req));
    X(FCHMOD, fchmod(req->file, req->mode));
    X(FCHOWN, fchown(req->file, req->uid, req->gid));
    X(LCHOWN, lchown(req->path, req->uid, req->gid));
    X(FDATASYNC, uv__fs_fdatasync(req));
    X(FSTAT, uv__fs_fstat(req->file, &req->statbuf));
    X(FSYNC, uv__fs_fsync(req));
    X(FTRUNCATE, ftruncate(req->file, req->off));
    X(FUTIME, uv__fs_futime(req));
    X(LSTAT, uv__fs_lstat(req->path, &req->statbuf));
    X(LINK, link(req->path, req->new_path));
    X(MKDIR, mkdir(req->path, req->mode));
    X(MKDTEMP, uv__fs_mkdtemp(req));
    X(OPEN, uv__fs_open(req));
    X(READ, uv__fs_read(req));
    X(SCANDIR, uv__fs_scandir(req));
    X(OPENDIR, uv__fs_opendir(req));
    X(READDIR, uv__fs_readdir(req));
    X(CLOSEDIR, uv__fs_closedir(req));
    X(READLINK, uv__fs_readlink(req));
    X(REALPATH, uv__fs_realpath(req));
    X(RENAME, rename(req->path, req->new_path));
    X(RMDIR, rmdir(req->path));
    X(SENDFILE, uv__fs_sendfile(req));
    X(STAT, uv__fs_stat(req->path, &req->statbuf));
    X(SYMLINK, symlink(req->path, req->new_path));
    X(UNLINK, unlink(req->path));
    X(UTIME, uv__fs_utime(req));
    X(WRITE, uv__fs_write_all(req));
    default: abort();
    }
#undef X
  } while (r == -1 && errno == EINTR && retry_on_eintr);

  if (r == -1)
    req->result = UV__ERR(errno);
  else
    req->result = r;

  if (r == 0 && (req->fs_type == UV_FS_STAT ||
                 req->fs_type == UV_FS_FSTAT ||
                 req->fs_type == UV_FS_LSTAT)) {
    req->ptr = &req->statbuf;
  }
}